

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

void __thiscall Clasp::Cli::ClaspAppOptions::initOptions(ClaspAppOptions *this,OptionContext *root)

{
  int iVar1;
  Value *pVVar2;
  code *pcVar3;
  OptionInitHelper *pOVar4;
  code *pcVar5;
  OptionGroup basic;
  string local_90;
  OptionGroup local_70;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Basic Options","");
  Potassco::ProgramOptions::OptionGroup::OptionGroup(&local_70,&local_90,desc_level_default);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)Potassco::ProgramOptions::OptionGroup::addOptions(&local_70);
  iVar1 = Potassco::ProgramOptions::store_true;
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pcVar5 = Potassco::ProgramOptions::FlagAction::store_false;
  pcVar3 = Potassco::ProgramOptions::FlagAction::store_false;
  if (iVar1 == 0) {
    pcVar3 = Potassco::ProgramOptions::FlagAction::store_true;
  }
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7f78;
  pVVar2[1]._vptr_Value = (_func_int **)&this->printPort;
  *(code **)&pVVar2[1].state_ = pcVar3;
  pVVar2->flags_ = pVVar2->flags_ | 0x13;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     ((OptionInitHelper *)&local_90,"print-portfolio,@1",pVVar2,
                      "Print default portfolio and exit");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7fb8;
  pVVar2[1]._vptr_Value = (_func_int **)this;
  *(code **)&pVVar2[1].state_ = mappedOpts;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_implicit,"2,2,2");
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<levels>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"quiet,q",pVVar2,
                      "Configure printing of models, costs, and calls\n      %A: <mod>[,<cost>][,<call>]\n        <mod> : print {0=all|1=last|2=no} models\n        <cost>: print {0=all|1=last|2=no} optimize values [<mod>]\n        <call>: print {0=all|1=last|2=no} call steps      [2]"
                     );
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7fb8;
  pVVar2[1]._vptr_Value = (_func_int **)this;
  *(code **)&pVVar2[1].state_ = mappedOpts;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<fmt>");
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_implicit,"aspif");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"pre",pVVar2,
                      "Print simplified program and exit\n      %A: Set output format to {aspif|smodels} (implicit: %I)"
                     );
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7ff8;
  pVVar2[1]._vptr_Value = (_func_int **)&this->outf;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<unsigned_int>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<n>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"outf,@1",pVVar2,"Use {0=default|1=competition|2=JSON|3=no} output");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e8038;
  pVVar2[1]._vptr_Value = (_func_int **)&this->outAtom;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<std::__cxx11::string>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"out-atomf,@2",pVVar2,"Set atom format string (<Pre>?%%0<Post>?)");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7fb8;
  pVVar2[1]._vptr_Value = (_func_int **)this;
  *(code **)&pVVar2[1].state_ = mappedOpts;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"out-ifs,@2",pVVar2,"Set internal field separator");
  iVar1 = Potassco::ProgramOptions::store_true;
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pcVar3 = Potassco::ProgramOptions::FlagAction::store_false;
  if (iVar1 == 0) {
    pcVar3 = Potassco::ProgramOptions::FlagAction::store_true;
  }
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7f78;
  pVVar2[1]._vptr_Value = (_func_int **)&this->hideAux;
  *(code **)&pVVar2[1].state_ = pcVar3;
  pVVar2->flags_ = pVVar2->flags_ | 0x13;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"out-hide-aux,@1",pVVar2,"Hide auxiliary atoms in answers");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e8038;
  pVVar2[1]._vptr_Value = (_func_int **)&this->lemmaIn;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<std::__cxx11::string>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<file>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"lemma-in,@1",pVVar2,"Read additional lemmas from %A");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e8038;
  pVVar2[1]._vptr_Value = (_func_int **)&this->lemmaLog;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<std::__cxx11::string>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<file>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"lemma-out,@1",pVVar2,"Log learnt lemmas to %A");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7ff8;
  pVVar2[1]._vptr_Value = (_func_int **)&(this->lemma).lbdMax;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<unsigned_int>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<n>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"lemma-out-lbd,@2",pVVar2,"Only log lemmas with lbd <= %A");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7ff8;
  pVVar2[1]._vptr_Value = (_func_int **)&this->lemma;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<unsigned_int>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<n>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"lemma-out-max,@2",pVVar2,"Stop logging after %A lemmas");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7fb8;
  pVVar2[1]._vptr_Value = (_func_int **)this;
  *(code **)&pVVar2[1].state_ = mappedOpts;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"lemma-out-dom,@2",pVVar2,
                      "Log lemmas over <arg {input|output}> variables");
  iVar1 = Potassco::ProgramOptions::store_true;
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  if (iVar1 == 0) {
    pcVar5 = Potassco::ProgramOptions::FlagAction::store_true;
  }
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e7f78;
  pVVar2[1]._vptr_Value = (_func_int **)&(this->lemma).logText;
  *(code **)&pVVar2[1].state_ = pcVar5;
  pVVar2->flags_ = pVVar2->flags_ | 0x13;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"lemma-out-txt,@2",pVVar2,"Log lemmas as ground integrity constraints")
  ;
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e8038;
  pVVar2[1]._vptr_Value = (_func_int **)&this->hccOut;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<std::__cxx11::string>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<file>");
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"hcc-out,@2",pVVar2,"Write non-hcf programs to %A.#scc");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e8078;
  pVVar2[1]._vptr_Value = (_func_int **)this;
  *(code **)&pVVar2[1].state_ =
       Potassco::string_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ;
  pVVar2->flags_ = pVVar2->flags_ | 0x14;
  pOVar4 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar4,"file,f,@3",pVVar2,"Input files");
  pVVar2 = (Value *)operator_new(0x28);
  Potassco::ProgramOptions::Value::Value(pVVar2,'\0',value_unassigned);
  pVVar2->_vptr_Value = (_func_int **)&PTR__Value_001e80b8;
  pVVar2[1]._vptr_Value = (_func_int **)&this->compute;
  *(code **)&pVVar2[1].state_ = Potassco::string_cast<int>;
  pVVar2->flags_ = pVVar2->flags_ | 0x10;
  pVVar2 = Potassco::ProgramOptions::Value::desc(pVVar2,desc_name,"<lit>");
  Potassco::ProgramOptions::OptionInitHelper::operator()
            (pOVar4,"compute,@2",pVVar2,"Force given literal to true");
  Potassco::ProgramOptions::OptionContext::add(root,&local_70);
  Potassco::ProgramOptions::OptionGroup::~OptionGroup(&local_70);
  return;
}

Assistant:

void ClaspAppOptions::initOptions(Potassco::ProgramOptions::OptionContext& root) {
	using namespace Potassco::ProgramOptions;
	OptionGroup basic("Basic Options");
	basic.addOptions()
		("print-portfolio,@1", flag(printPort), "Print default portfolio and exit")
		("quiet,q"    , notify(this, &ClaspAppOptions::mappedOpts)->implicit("2,2,2")->arg("<levels>"),
		 "Configure printing of models, costs, and calls\n"
		 "      %A: <mod>[,<cost>][,<call>]\n"
		 "        <mod> : print {0=all|1=last|2=no} models\n"
		 "        <cost>: print {0=all|1=last|2=no} optimize values [<mod>]\n"
		 "        <call>: print {0=all|1=last|2=no} call steps      [2]")
		("pre", notify(this, &ClaspAppOptions::mappedOpts)->arg("<fmt>")->implicit("aspif"), "Print simplified program and exit\n"
		 "      %A: Set output format to {aspif|smodels} (implicit: %I)")
		("outf,@1", storeTo(outf)->arg("<n>"), "Use {0=default|1=competition|2=JSON|3=no} output")
		("out-atomf,@2" , storeTo(outAtom), "Set atom format string (<Pre>?%%0<Post>?)")
		("out-ifs,@2"   , notify(this, &ClaspAppOptions::mappedOpts), "Set internal field separator")
		("out-hide-aux,@1" , flag(hideAux), "Hide auxiliary atoms in answers")
		("lemma-in,@1"     , storeTo(lemmaIn)->arg("<file>"), "Read additional lemmas from %A")
		("lemma-out,@1"    , storeTo(lemmaLog)->arg("<file>"), "Log learnt lemmas to %A")
		("lemma-out-lbd,@2", storeTo(lemma.lbdMax)->arg("<n>"), "Only log lemmas with lbd <= %A")
		("lemma-out-max,@2", storeTo(lemma.logMax)->arg("<n>"), "Stop logging after %A lemmas")
		("lemma-out-dom,@2", notify(this, &ClaspAppOptions::mappedOpts), "Log lemmas over <arg {input|output}> variables")
		("lemma-out-txt,@2", flag(lemma.logText), "Log lemmas as ground integrity constraints")
		("hcc-out,@2", storeTo(hccOut)->arg("<file>"), "Write non-hcf programs to %A.#scc")
		("file,f,@3" , storeTo(input)->composing(), "Input files")
		("compute,@2", storeTo(compute)->arg("<lit>"), "Force given literal to true")
	;
	root.add(basic);
}